

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O3

size_t Tools::leaf_index(bitset_t *split)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  size_type sVar4;
  invalid_argument *this;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type sVar9;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  puVar1 = (split->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (split->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  lVar7 = 0;
  lVar5 = (long)puVar2 - (long)puVar1;
  if (puVar2 != puVar1) {
    lVar8 = 0;
    do {
      lVar8 = lVar8 + (ulong)(byte)boost::detail::dynamic_bitset_impl::count_table<true>::table
                                   [*(byte *)((long)puVar1 + lVar7)];
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
    if (lVar8 == 1) {
      sVar9 = split->m_num_bits;
      sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                        (split,0);
      uVar6 = ~sVar4;
      goto LAB_00153c9e;
    }
    lVar8 = 0;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + (ulong)(byte)boost::detail::dynamic_bitset_impl::count_table<true>::table
                                   [*(byte *)((long)puVar1 + lVar8)];
      lVar8 = lVar8 + 1;
    } while (lVar5 != lVar8);
  }
  uVar6 = split->m_num_bits;
  if (lVar7 != uVar6 - 1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Not a leaf");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~(&local_30,split);
  sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                    (&local_30,0);
  bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_30);
  if (!bVar3) {
    __assert_fail("m_check_invariants()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x279,
                  "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  sVar9 = ~sVar4;
  if (local_30.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00153c9e:
  return uVar6 + sVar9;
}

Assistant:

size_t Tools::leaf_index(const bitset_t split) {
    if (split.count() == 1) {
        return split.size() - split.find_first() - 1;
    }
    else if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    }
    else {
        throw std::invalid_argument("Not a leaf");
    }
}